

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void CheckTABLE(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  AttVal *pAVar2;
  tmbstr ptVar3;
  
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_SUMMARY);
  iVar1 = prvTidyHTMLVersion(doc);
  prvTidyCheckAttributes(doc,node);
  if ((doc->config).value[1].v == 0) {
    if ((pAVar2 == (AttVal *)0x0) || ((iVar1 - 0x20000U & 0xfffdffff) != 0)) {
      if ((pAVar2 == (AttVal *)0x0) && ((iVar1 != 0x20000 && (iVar1 != 0x40000)))) {
        *(byte *)&doc->badAccess = (byte)doc->badAccess | 4;
        prvTidyReportMissingAttr(doc,node,"summary");
      }
    }
    else {
      prvTidyReport(doc,node,node,0x22d);
    }
  }
  if (*(int *)((doc->config).value + 100) != 0) {
    pAVar2 = prvTidyAttrGetById(node,TidyAttr_BORDER);
    if ((pAVar2 != (AttVal *)0x0) && (pAVar2->value == (tmbstr)0x0)) {
      ptVar3 = prvTidytmbstrdup(doc->allocator,"1");
      pAVar2->value = ptVar3;
    }
  }
  return;
}

Assistant:

void CheckTABLE( TidyDocImpl* doc, Node *node )
{
    AttVal* attval;
    Bool HasSummary = (TY_(AttrGetById)(node, TidyAttr_SUMMARY) != NULL) ? yes : no;
    uint vers = TY_(HTMLVersion)(doc);  /* Issue #377 - Also applies to XHTML5 */
    Bool isHTML5 = ((vers == HT50)||(vers == XH50)) ? yes : no;

    TY_(CheckAttributes)(doc, node);

    /* Issue #210 - a missing summary attribute is bad accessibility, no matter
       what HTML version is involved; a document without is valid 
       EXCEPT for HTML5, when to have a summary is wrong */
    if (cfg(doc, TidyAccessibilityCheckLevel) == 0)
    {
        if (HasSummary && isHTML5)
        {
            /* #210 - has summary, and is HTML5, then report obsolete */
            TY_(Report)(doc, node, node, BAD_SUMMARY_HTML5);
        } 
        else if (!HasSummary && !isHTML5) 
        {
            /* #210 - No summary, and NOT HTML5, then report as before */
            doc->badAccess |= BA_MISSING_SUMMARY;
            TY_(ReportMissingAttr)( doc, node, "summary");
        }
    }

    /* convert <table border> to <table border="1"> */
    if ( cfgBool(doc, TidyXmlOut) && (attval = TY_(AttrGetById)(node, TidyAttr_BORDER)) )
    {
        if (attval->value == NULL)
            attval->value = TY_(tmbstrdup)(doc->allocator, "1");
    }
}